

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# beagle_BeagleJNIWrapper.cpp
# Opt level: O0

jint Java_beagle_BeagleJNIWrapper_transposeTransitionMatrices
               (JNIEnv *env,jobject param_2,jint instance,jintArray jInIndices,jintArray jOutIndices
               ,jint matrixCount)

{
  jint jVar1;
  jintArray array;
  jint *elems;
  undefined4 in_EDX;
  undefined4 in_R9D;
  jint *outIndices;
  jint *inIndices;
  jint errCode;
  undefined4 in_stack_ffffffffffffffb8;
  jint in_stack_ffffffffffffffbc;
  JNIEnv_ *in_stack_ffffffffffffffc0;
  
  array = (jintArray)
          JNIEnv_::GetIntArrayElements
                    (in_stack_ffffffffffffffc0,
                     (jintArray)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                     (jboolean *)0x105574);
  elems = JNIEnv_::GetIntArrayElements
                    (in_stack_ffffffffffffffc0,
                     (jintArray)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                     (jboolean *)0x10558c);
  jVar1 = beagleTransposeTransitionMatrices(in_EDX,array,elems,in_R9D);
  JNIEnv_::ReleaseIntArrayElements
            ((JNIEnv_ *)CONCAT44(in_R9D,jVar1),array,elems,in_stack_ffffffffffffffbc);
  return jVar1;
}

Assistant:

JNIEXPORT jint JNICALL Java_beagle_BeagleJNIWrapper_transposeTransitionMatrices
        (JNIEnv *env, jobject, jint instance, jintArray jInIndices, jintArray jOutIndices, jint matrixCount) {

    jint errCode;

    jint *inIndices = env->GetIntArrayElements(jInIndices, NULL);
    jint *outIndices = env->GetIntArrayElements(jOutIndices, NULL);

    errCode = (jint)beagleTransposeTransitionMatrices(instance, (int *)inIndices, (int *)outIndices, matrixCount);

    env->ReleaseIntArrayElements(jInIndices, inIndices, JNI_ABORT);

    return errCode;
}